

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

uint32_t __thiscall spirv_cross::ParsedIR::increase_bound_by(ParsedIR *this,uint32_t incr_amount)

{
  size_t sVar1;
  ObjectPoolGroup *in_RAX;
  size_t count;
  bool bVar2;
  _Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false> local_38;
  
  sVar1 = (this->ids).super_VectorView<spirv_cross::Variant>.buffer_size;
  count = incr_amount + sVar1;
  local_38._M_head_impl = in_RAX;
  SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,count);
  while (bVar2 = incr_amount != 0, incr_amount = incr_amount - 1, bVar2) {
    local_38._M_head_impl =
         (this->pool_group)._M_t.
         super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
         ._M_t.
         super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
         .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    SmallVector<spirv_cross::Variant,8ul>::emplace_back<spirv_cross::ObjectPoolGroup*>
              ((SmallVector<spirv_cross::Variant,8ul> *)&this->ids,&local_38._M_head_impl);
  }
  SmallVector<unsigned_char,_8UL>::resize(&this->block_meta,count);
  return (uint32_t)sVar1;
}

Assistant:

uint32_t ParsedIR::increase_bound_by(uint32_t incr_amount)
{
	auto curr_bound = ids.size();
	auto new_bound = curr_bound + incr_amount;

	ids.reserve(ids.size() + incr_amount);
	for (uint32_t i = 0; i < incr_amount; i++)
		ids.emplace_back(pool_group.get());

	block_meta.resize(new_bound);
	return uint32_t(curr_bound);
}